

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall
QGraphicsViewPrivate::updateRubberBand(QGraphicsViewPrivate *this,QMouseEvent *event)

{
  QRect *lhs;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ItemSelectionMode mode;
  ItemSelectionOperation selectionOperation;
  undefined4 uVar5;
  QAbstractScrollArea *this_00;
  undefined4 uVar7;
  Data *pDVar6;
  undefined1 auVar8 [16];
  qreal qVar9;
  bool bVar10;
  QPoint QVar11;
  QWidget *pQVar12;
  QWidget *pQVar13;
  QPoint QVar14;
  int iVar15;
  int iVar16;
  Representation RVar17;
  int iVar18;
  int iVar19;
  Representation RVar20;
  QWidget *pQVar21;
  QObject *this_01;
  long in_FS_OFFSET;
  undefined1 auVar22 [16];
  QPainterPath selectionArea;
  undefined1 *local_a0;
  QRect local_98;
  QPointF local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->dragMode != RubberBandDrag) || ((this->field_0x300 & 1) == 0)) ||
     (this->rubberBanding != true)) goto LAB_005ba0a2;
  this_00 = *(QAbstractScrollArea **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  pQVar21 = (QWidget *)event;
  local_88 = QSinglePointEvent::position((QSinglePointEvent *)event);
  QVar11 = QPointF::toPoint(&stack0xffffffffffffff78);
  iVar15 = (this->mousePressViewPoint).xp.m_i - QVar11.xp.m_i;
  iVar18 = (this->mousePressViewPoint).yp.m_i - QVar11.yp.m_i;
  iVar16 = -iVar15;
  if (0 < iVar15) {
    iVar16 = iVar15;
  }
  iVar19 = -iVar18;
  if (0 < iVar18) {
    iVar19 = iVar18;
  }
  iVar18 = QApplication::startDragDistance();
  if (iVar19 + iVar16 < iVar18) goto LAB_005ba0a2;
  if ((this->viewportUpdateMode != NoViewportUpdate) &&
     (uVar1 = (this->rubberBandRect).x1, uVar3 = (this->rubberBandRect).y1,
     uVar2 = (this->rubberBandRect).x2, uVar4 = (this->rubberBandRect).y2,
     auVar22._0_4_ = -(uint)((int)uVar2 < (int)uVar1), auVar22._4_4_ = auVar22._0_4_,
     auVar22._8_4_ = -(uint)((int)uVar4 < (int)uVar3),
     auVar22._12_4_ = -(uint)((int)uVar4 < (int)uVar3), iVar16 = movmskpd(iVar15,auVar22),
     iVar16 == 0)) {
    if (this->viewportUpdateMode == FullViewportUpdate) {
      updateAll(this);
    }
    else {
      pQVar12 = QAbstractScrollArea::viewport(this_00);
      pQVar13 = QAbstractScrollArea::viewport(this_00);
      rubberBandRegion((QGraphicsViewPrivate *)&stack0xffffffffffffff78,pQVar21,(QRect *)pQVar13);
      QWidget::update(pQVar12,(QRegion *)&stack0xffffffffffffff78);
      QRegion::~QRegion((QRegion *)&stack0xffffffffffffff78);
    }
  }
  if (*(int *)(event + 0x44) == 0) {
    this->rubberBanding = false;
    this->rubberBandSelectionOperation = ReplaceSelection;
    bVar10 = QRect::isNull(&this->rubberBandRect);
    if (!bVar10) {
      (this->rubberBandRect).x1 = 0;
      (this->rubberBandRect).y1 = 0;
      (this->rubberBandRect).x2 = -1;
      (this->rubberBandRect).y2 = -1;
      uVar5 = (this->rubberBandRect).x2;
      uVar7 = (this->rubberBandRect).y2;
      auVar8._4_4_ = uVar7;
      auVar8._0_4_ = uVar5;
      auVar8._8_8_ = 0;
      QGraphicsView::rubberBandChanged
                ((QGraphicsView *)this_00,(QRect)(auVar8 << 0x40),(QPointF)ZEXT816(0),
                 (QPointF)ZEXT816(0));
    }
    goto LAB_005ba0a2;
  }
  lhs = &this->rubberBandRect;
  local_98.x1.m_i = (this->rubberBandRect).x1.m_i;
  local_98.y1.m_i = (this->rubberBandRect).y1.m_i;
  local_98.x2.m_i = (this->rubberBandRect).x2.m_i;
  local_98.y2.m_i = (this->rubberBandRect).y2.m_i;
  QVar14 = QGraphicsView::mapFromScene((QGraphicsView *)this_00,&this->mousePressScenePoint);
  RVar20 = QVar14.yp.m_i;
  local_88 = QSinglePointEvent::position((QSinglePointEvent *)event);
  QVar11 = QPointF::toPoint(&stack0xffffffffffffff78);
  RVar17 = QVar11.yp.m_i;
  iVar16 = QVar14.xp.m_i.m_i - QVar11.xp.m_i;
  if (QVar14.xp.m_i.m_i < QVar11.xp.m_i.m_i) {
    QVar11 = QVar14;
  }
  iVar15 = RVar20.m_i - RVar17.m_i;
  if (RVar20.m_i < RVar17.m_i) {
    RVar17.m_i = RVar20.m_i;
  }
  iVar18 = -iVar16;
  if (0 < iVar16) {
    iVar18 = iVar16;
  }
  iVar16 = -iVar15;
  if (0 < iVar15) {
    iVar16 = iVar15;
  }
  (this->rubberBandRect).x1.m_i = QVar11.xp.m_i.m_i;
  (this->rubberBandRect).y1.m_i = RVar17.m_i;
  (this->rubberBandRect).x2.m_i = iVar18 + QVar11.xp.m_i.m_i;
  (this->rubberBandRect).y2.m_i = iVar16 + RVar17.m_i;
  bVar10 = ::operator!=(lhs,&local_98);
  if (bVar10) {
LAB_005b9ee7:
    qVar9 = (this->lastMouseMoveScenePoint).yp;
    (this->lastRubberbandScenePoint).xp = (this->lastMouseMoveScenePoint).xp;
    (this->lastRubberbandScenePoint).yp = qVar9;
    local_98.x1.m_i = (lhs->x1).m_i;
    local_98.y1.m_i = (lhs->y1).m_i;
    local_98.x2.m_i = (this->rubberBandRect).x2.m_i;
    local_98.y2.m_i = (this->rubberBandRect).y2.m_i;
    pQVar21 = *(QWidget **)&this->rubberBandRect;
    QGraphicsView::rubberBandChanged
              ((QGraphicsView *)this_00,this->rubberBandRect,this->mousePressScenePoint,
               this->lastRubberbandScenePoint);
  }
  else {
    pQVar21 = (QWidget *)&this->lastMouseMoveScenePoint;
    bVar10 = ::operator!=(&this->lastRubberbandScenePoint,(QPointF *)pQVar21);
    if (bVar10) goto LAB_005b9ee7;
  }
  if (this->viewportUpdateMode == FullViewportUpdate) {
    updateAll(this);
  }
  else if (this->viewportUpdateMode != NoViewportUpdate) {
    pQVar12 = QAbstractScrollArea::viewport(this_00);
    pQVar13 = QAbstractScrollArea::viewport(this_00);
    rubberBandRegion((QGraphicsViewPrivate *)&stack0xffffffffffffff78,pQVar21,(QRect *)pQVar13);
    QWidget::update(pQVar12,(QRegion *)&stack0xffffffffffffff78);
    QRegion::~QRegion((QRegion *)&stack0xffffffffffffff78);
  }
  local_a0 = &DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)&local_a0);
  QGraphicsView::mapToScene((QPolygonF *)&stack0xffffffffffffff78,(QGraphicsView *)this_00,lhs);
  QPainterPath::addPolygon((QPolygonF *)&local_a0);
  QArrayDataPointer<QPointF>::~QArrayDataPointer
            ((QArrayDataPointer<QPointF> *)&stack0xffffffffffffff78);
  QPainterPath::closeSubpath();
  bVar10 = QPointer::operator_cast_to_bool((QPointer *)&this->scene);
  if (bVar10) {
    pDVar6 = (this->scene).wp.d;
    if ((pDVar6 == (Data *)0x0) || (*(int *)(pDVar6 + 4) == 0)) {
      this_01 = (QObject *)0x0;
    }
    else {
      this_01 = (this->scene).wp.value;
    }
    mode = this->rubberBandSelectionMode;
    selectionOperation = this->rubberBandSelectionOperation;
    QGraphicsView::viewportTransform
              ((QTransform *)&stack0xffffffffffffff78,(QGraphicsView *)this_00);
    QGraphicsScene::setSelectionArea
              ((QGraphicsScene *)this_01,(QPainterPath *)&local_a0,selectionOperation,mode,
               (QTransform *)&stack0xffffffffffffff78);
  }
  QPainterPath::~QPainterPath((QPainterPath *)&local_a0);
LAB_005ba0a2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::updateRubberBand(const QMouseEvent *event)
{
    Q_Q(QGraphicsView);
    if (dragMode != QGraphicsView::RubberBandDrag || !sceneInteractionAllowed || !rubberBanding)
        return;
    // Check for enough drag distance
    if ((mousePressViewPoint - event->position().toPoint()).manhattanLength() < QApplication::startDragDistance())
        return;

    // Update old rubberband
    if (viewportUpdateMode != QGraphicsView::NoViewportUpdate && !rubberBandRect.isEmpty()) {
        if (viewportUpdateMode != QGraphicsView::FullViewportUpdate)
            q->viewport()->update(rubberBandRegion(q->viewport(), rubberBandRect));
        else
            updateAll();
    }

    // Stop rubber banding if the user has let go of all buttons (even
    // if we didn't get the release events).
    if (!event->buttons()) {
        rubberBanding = false;
        rubberBandSelectionOperation = Qt::ReplaceSelection;
        if (!rubberBandRect.isNull()) {
            rubberBandRect = QRect();
            emit q->rubberBandChanged(rubberBandRect, QPointF(), QPointF());
        }
        return;
    }

    QRect oldRubberband = rubberBandRect;

    // Update rubberband position
    const QPoint mp = q->mapFromScene(mousePressScenePoint);
    const QPoint ep = event->position().toPoint();
    rubberBandRect = QRect(qMin(mp.x(), ep.x()), qMin(mp.y(), ep.y()),
                           qAbs(mp.x() - ep.x()) + 1, qAbs(mp.y() - ep.y()) + 1);

    if (rubberBandRect != oldRubberband || lastRubberbandScenePoint != lastMouseMoveScenePoint) {
        lastRubberbandScenePoint = lastMouseMoveScenePoint;
        oldRubberband = rubberBandRect;
        emit q->rubberBandChanged(rubberBandRect, mousePressScenePoint, lastRubberbandScenePoint);
    }

    // Update new rubberband
    if (viewportUpdateMode != QGraphicsView::NoViewportUpdate) {
        if (viewportUpdateMode != QGraphicsView::FullViewportUpdate)
            q->viewport()->update(rubberBandRegion(q->viewport(), rubberBandRect));
        else
            updateAll();
    }
            // Set the new selection area
    QPainterPath selectionArea;
    selectionArea.addPolygon(q->mapToScene(rubberBandRect));
    selectionArea.closeSubpath();
    if (scene)
        scene->setSelectionArea(selectionArea, rubberBandSelectionOperation, rubberBandSelectionMode, q->viewportTransform());
}